

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.cpp
# Opt level: O0

void TTD::NSSnapObjects::DoAddtlValueInstantiation_SnapMapInfo
               (SnapObject *snpObject,RecyclableObject *obj,InflateMap *inflator)

{
  SnapMapInfo *pSVar1;
  Var pvVar2;
  Var pvVar3;
  Var data_1;
  Var key_1;
  uint32 i_1;
  JavascriptWeakMap *mobj_1;
  Var data;
  Var key;
  uint32 i;
  JavascriptMap *mobj;
  SnapMapInfo *mapInfo;
  InflateMap *inflator_local;
  RecyclableObject *obj_local;
  SnapObject *snpObject_local;
  
  pSVar1 = SnapObjectGetAddtlInfoAs<TTD::NSSnapObjects::SnapMapInfo*,(TTD::NSSnapObjects::SnapObjectType)26>
                     (snpObject);
  if (snpObject->SnapType->JsTypeId == TypeIds_Map) {
    for (key._4_4_ = 0; key._4_4_ < pSVar1->MapSize; key._4_4_ = key._4_4_ + 2) {
      pvVar2 = InflateMap::InflateTTDVar(inflator,pSVar1->MapKeyValueArray[key._4_4_]);
      pvVar3 = InflateMap::InflateTTDVar(inflator,pSVar1->MapKeyValueArray[key._4_4_ + 1]);
      Js::JavascriptLibrary::AddMapElementInflate_TTD((JavascriptMap *)obj,pvVar2,pvVar3);
    }
  }
  else {
    for (key_1._4_4_ = 0; key_1._4_4_ < pSVar1->MapSize; key_1._4_4_ = key_1._4_4_ + 2) {
      pvVar2 = InflateMap::InflateTTDVar(inflator,pSVar1->MapKeyValueArray[key_1._4_4_]);
      pvVar3 = InflateMap::InflateTTDVar(inflator,pSVar1->MapKeyValueArray[key_1._4_4_ + 1]);
      Js::JavascriptLibrary::AddWeakMapElementInflate_TTD((JavascriptWeakMap *)obj,pvVar2,pvVar3);
    }
  }
  return;
}

Assistant:

void DoAddtlValueInstantiation_SnapMapInfo(const SnapObject* snpObject, Js::RecyclableObject* obj, InflateMap* inflator)
        {
            SnapMapInfo* mapInfo = SnapObjectGetAddtlInfoAs<SnapMapInfo*, SnapObjectType::SnapMapObject>(snpObject);

            if(snpObject->SnapType->JsTypeId == Js::TypeIds_Map)
            {
                Js::JavascriptMap* mobj = (Js::JavascriptMap*)obj;
                for(uint32 i = 0; i < mapInfo->MapSize; i += 2)
                {
                    Js::Var key = inflator->InflateTTDVar(mapInfo->MapKeyValueArray[i]);
                    Js::Var data = inflator->InflateTTDVar(mapInfo->MapKeyValueArray[i + 1]);
                    Js::JavascriptLibrary::AddMapElementInflate_TTD(mobj, key, data);
                }
            }
            else
            {
                Js::JavascriptWeakMap* mobj = (Js::JavascriptWeakMap*)obj;
                for(uint32 i = 0; i < mapInfo->MapSize; i += 2)
                {
                    Js::Var key = inflator->InflateTTDVar(mapInfo->MapKeyValueArray[i]);
                    Js::Var data = inflator->InflateTTDVar(mapInfo->MapKeyValueArray[i + 1]);
                    Js::JavascriptLibrary::AddWeakMapElementInflate_TTD(mobj, key, data);
                }
            }
        }